

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall reduceDB_lt::operator()(reduceDB_lt *this,CRef x,CRef y)

{
  float fVar1;
  int iVar2;
  Clause *pCVar3;
  float *pfVar4;
  ClauseAllocator *in_RDI;
  CRef in_stack_ffffffffffffffdc;
  CRef r;
  undefined1 local_11;
  
  pCVar3 = Minisat::ClauseAllocator::operator[](in_RDI,in_stack_ffffffffffffffdc);
  iVar2 = Minisat::Clause::size(pCVar3);
  local_11 = false;
  if (2 < iVar2) {
    pCVar3 = Minisat::ClauseAllocator::operator[](in_RDI,in_stack_ffffffffffffffdc);
    iVar2 = Minisat::Clause::size(pCVar3);
    r = CONCAT13(1,(int3)in_stack_ffffffffffffffdc);
    if (iVar2 != 2) {
      Minisat::ClauseAllocator::operator[](in_RDI,r);
      pfVar4 = Minisat::Clause::activity((Clause *)in_RDI);
      fVar1 = *pfVar4;
      Minisat::ClauseAllocator::operator[](in_RDI,r);
      pfVar4 = Minisat::Clause::activity((Clause *)in_RDI);
      r = (uint)(fVar1 < *pfVar4) << 0x18;
    }
    local_11 = SUB41(r >> 0x18,0);
  }
  return local_11;
}

Assistant:

bool operator () (CRef x, CRef y) { 
        return ca[x].size() > 2 && (ca[y].size() == 2 || ca[x].activity() < ca[y].activity()); }